

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_stream_input.cpp
# Opt level: O3

input * mpt::io::stream::input::create(streaminfo *info)

{
  input *piVar1;
  
  piVar1 = (input *)operator_new(0x50);
  (piVar1->super_input).super_metatype.super_convertable._vptr_convertable =
       (_func_int **)&PTR_convert_001496a8;
  stream(&piVar1->super_stream,info);
  (piVar1->super_input).super_metatype.super_convertable._vptr_convertable =
       (_func_int **)&PTR_convert_00149560;
  (piVar1->super_stream).super_object._vptr_object = (_func_int **)&PTR_property_001495b0;
  (piVar1->super_stream).super_output._vptr_output = (_func_int **)&PTR_push_00149628;
  (piVar1->super_stream).super_interface._vptr_interface = (_func_int **)&PTR_write_00149650;
  piVar1[1].super_input.super_metatype.super_convertable._vptr_convertable = (_func_int **)0x1;
  return piVar1;
}

Assistant:

io::stream::input *io::stream::input::create(const streaminfo *info)
{
	class stream_input : public input
	{
	public:
		inline stream_input(const streaminfo *info) : input(info), _ref(1)
		{ }
		void unref() __MPT_OVERRIDE
		{
			if (_ref.lower()) {
				return;
			}
			delete this;
		}
		uintptr_t addref() __MPT_OVERRIDE
		{
			return _ref.raise();
		}
	private:
		refcount _ref;
	};
	return new stream_input(info);
}